

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_analysis.cc
# Opt level: O1

void __thiscall
pass_check_combinational_loop_Test::TestBody(pass_check_combinational_loop_Test *this)

{
  size_type *psVar1;
  _Alloc_hider this_00;
  bool bVar2;
  Generator *this_01;
  Var *this_02;
  Const *var;
  undefined1 local_1a0 [8];
  Context c;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_70 [4];
  AssertHelper local_50;
  undefined1 auStack_48 [8];
  TrueWithString gtest_msg;
  
  local_1a0 = (undefined1  [8])&c.modules_._M_h._M_rehash_policy._M_next_resize;
  c.modules_._M_h._M_buckets = (__buckets_ptr)0x1;
  c.modules_._M_h._M_bucket_count = 0;
  c.modules_._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  c.modules_._M_h._M_element_count._0_4_ = 0x3f800000;
  c.modules_._M_h._M_rehash_policy._M_max_load_factor = 0.0;
  c.modules_._M_h._M_rehash_policy._4_4_ = 0;
  c.modules_._M_h._M_rehash_policy._M_next_resize = 0;
  c.modules_._M_h._M_single_bucket =
       (__node_base_ptr)&c.generator_hash_._M_h._M_rehash_policy._M_next_resize;
  c.generator_hash_._M_h._M_buckets = (__buckets_ptr)0x1;
  c.generator_hash_._M_h._M_bucket_count = 0;
  c.generator_hash_._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  c.generator_hash_._M_h._M_element_count._0_4_ = 0x3f800000;
  c.enum_defs_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)&c.enum_defs_;
  c.enum_defs_._M_t._M_impl._0_4_ = 0;
  c.enum_defs_._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  c.enum_defs_._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  c.generator_hash_._M_h._M_rehash_policy._M_max_load_factor = 0.0;
  c.generator_hash_._M_h._M_rehash_policy._4_4_ = 0;
  c.generator_hash_._M_h._M_rehash_policy._M_next_resize = 0;
  c.generator_hash_._M_h._M_single_bucket = (__node_base_ptr)0x0;
  c.enum_defs_._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  c.enum_defs_._M_t._M_impl.super__Rb_tree_header._M_node_count =
       (size_t)&c.empty_generators_._M_h._M_rehash_policy._M_next_resize;
  c.empty_generators_._M_h._M_buckets = (__buckets_ptr)0x1;
  c.empty_generators_._M_h._M_bucket_count = 0;
  c.empty_generators_._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  c.empty_generators_._M_h._M_element_count._0_4_ = 0x3f800000;
  c._224_8_ = &c.tracked_generators_._M_h._M_rehash_policy._M_next_resize;
  c.empty_generators_._M_h._M_rehash_policy._M_max_load_factor = 0.0;
  c.empty_generators_._M_h._M_rehash_policy._4_4_ = 0;
  c.empty_generators_._M_h._M_rehash_policy._M_next_resize = 0;
  c.empty_generators_._M_h._M_single_bucket._0_1_ = 0;
  c.tracked_generators_._M_h._M_buckets = (__buckets_ptr)0x1;
  c.tracked_generators_._M_h._M_bucket_count = 0;
  c.tracked_generators_._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  c.tracked_generators_._M_h._M_element_count._0_4_ = 0x3f800000;
  c.tracked_generators_._M_h._M_rehash_policy._M_max_load_factor = 0.0;
  c.tracked_generators_._M_h._M_rehash_policy._4_4_ = 0;
  c.tracked_generators_._M_h._M_rehash_policy._M_next_resize = 0;
  psVar1 = &gtest_msg.value._M_string_length;
  c.enum_defs_._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       c.enum_defs_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  auStack_48 = (undefined1  [8])psVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)auStack_48,"mod","");
  this_01 = kratos::Context::generator((Context *)local_1a0,(string *)auStack_48);
  if (auStack_48 != (undefined1  [8])psVar1) {
    operator_delete((void *)auStack_48,gtest_msg.value._M_string_length + 1);
  }
  auStack_48 = (undefined1  [8])psVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)auStack_48,"a","");
  this_02 = kratos::Generator::var(this_01,(string *)auStack_48,1);
  if (auStack_48 != (undefined1  [8])psVar1) {
    operator_delete((void *)auStack_48,gtest_msg.value._M_string_length + 1);
  }
  var = kratos::Const::constant(1,1,false);
  kratos::Var::operator+(this_02,&var->super_Var);
  kratos::Var::assign((Var *)auStack_48,this_02);
  this_00 = gtest_msg.value._M_dataplus;
  c.tracked_generators_._M_h._M_single_bucket = (__node_base_ptr)auStack_48;
  auStack_48 = (undefined1  [8])0x0;
  gtest_msg.value._M_dataplus._M_p = (pointer)0x0;
  kratos::Generator::add_stmt
            (this_01,(shared_ptr<kratos::Stmt> *)&c.tracked_generators_._M_h._M_single_bucket);
  if (this_00._M_p != (pointer)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_00._M_p);
  }
  if (gtest_msg.value._M_dataplus._M_p != (pointer)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)gtest_msg.value._M_dataplus._M_p);
  }
  kratos::fix_assignment_type(this_01);
  gtest_msg.value.field_2._M_allocated_capacity = 0;
  gtest_msg.value._M_dataplus._M_p = (pointer)0x0;
  gtest_msg.value._M_string_length = 0;
  auStack_48 = (undefined1  [8])psVar1;
  bVar2 = testing::internal::AlwaysTrue();
  if (bVar2) {
    kratos::check_combinational_loop(this_01);
  }
  std::__cxx11::string::_M_replace((ulong)auStack_48,0,gtest_msg.value._M_dataplus._M_p,0x23e8ee);
  testing::Message::Message((Message *)local_70);
  testing::internal::AssertHelper::AssertHelper
            (&local_50,kNonFatalFailure,
             "/workspace/llm4binary/github/license_c_cmakelists/Kuree[P]kratos/tests/test_analysis.cc"
             ,0x7c,(char *)auStack_48);
  testing::internal::AssertHelper::operator=(&local_50,(Message *)local_70);
  testing::internal::AssertHelper::~AssertHelper(&local_50);
  if (local_70[0]._M_head_impl !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    (**(code **)(*(long *)local_70[0]._M_head_impl + 8))();
  }
  if (auStack_48 != (undefined1  [8])psVar1) {
    operator_delete((void *)auStack_48,gtest_msg.value._M_string_length + 1);
  }
  std::
  _Hashtable<kratos::Generator_*,_kratos::Generator_*,_std::allocator<kratos::Generator_*>,_std::__detail::_Identity,_std::equal_to<kratos::Generator_*>,_std::hash<kratos::Generator_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable((_Hashtable<kratos::Generator_*,_kratos::Generator_*,_std::allocator<kratos::Generator_*>,_std::__detail::_Identity,_std::equal_to<kratos::Generator_*>,_std::hash<kratos::Generator_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 *)&c.track_generated_);
  std::
  _Hashtable<std::shared_ptr<kratos::Generator>,_std::shared_ptr<kratos::Generator>,_std::allocator<std::shared_ptr<kratos::Generator>_>,_std::__detail::_Identity,_std::equal_to<std::shared_ptr<kratos::Generator>_>,_std::hash<std::shared_ptr<kratos::Generator>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable((_Hashtable<std::shared_ptr<kratos::Generator>,_std::shared_ptr<kratos::Generator>,_std::allocator<std::shared_ptr<kratos::Generator>_>,_std::__detail::_Identity,_std::equal_to<std::shared_ptr<kratos::Generator>_>,_std::hash<std::shared_ptr<kratos::Generator>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 *)&c.enum_defs_._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Enum>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Enum>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Enum>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Enum>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Enum>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Enum>_>_>_>
               *)&c.max_instance_id_);
  std::
  _Hashtable<const_kratos::Generator_*,_std::pair<const_kratos::Generator_*const,_unsigned_long>,_std::allocator<std::pair<const_kratos::Generator_*const,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<const_kratos::Generator_*>,_std::hash<const_kratos::Generator_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable((_Hashtable<const_kratos::Generator_*,_std::pair<const_kratos::Generator_*const,_unsigned_long>,_std::allocator<std::pair<const_kratos::Generator_*const,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<const_kratos::Generator_*>,_std::hash<const_kratos::Generator_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                 *)&c.modules_._M_h._M_single_bucket);
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::shared_ptr<kratos::Generator>,_std::less<std::shared_ptr<kratos::Generator>_>,_std::allocator<std::shared_ptr<kratos::Generator>_>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::shared_ptr<kratos::Generator>,_std::less<std::shared_ptr<kratos::Generator>_>,_std::allocator<std::shared_ptr<kratos::Generator>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::shared_ptr<kratos::Generator>,_std::less<std::shared_ptr<kratos::Generator>_>,_std::allocator<std::shared_ptr<kratos::Generator>_>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::shared_ptr<kratos::Generator>,_std::less<std::shared_ptr<kratos::Generator>_>,_std::allocator<std::shared_ptr<kratos::Generator>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)local_1a0);
  return;
}

Assistant:

TEST(pass, check_combinational_loop) {  // NOLINT
    Context c;
    auto &mod = c.generator("mod");
    auto &a = mod.var("a", 1);
    mod.add_stmt(a.assign(a + constant(1, 1)));
    fix_assignment_type(&mod);

    EXPECT_THROW(check_combinational_loop(&mod), StmtException);
}